

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

bool jessilib::equals<char,char32_t>
               (basic_string_view<char,_std::char_traits<char>_> lhs,
               basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs)

{
  char32_t *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  jessilib *this;
  decode_result dVar5;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  
  pcVar4 = lhs._M_str;
  this = (jessilib *)lhs._M_len;
  pcVar1 = rhs._M_str;
  pcVar2 = (char *)rhs._M_len;
  for (pcVar3 = pcVar2; (this != (jessilib *)0x0 && (pcVar3 != (char *)0x0)); pcVar3 = pcVar3 + -1)
  {
    in_string._M_str = pcVar2;
    in_string._M_len = (size_t)pcVar4;
    dVar5 = decode_codepoint_utf8<char>(this,in_string);
    pcVar2 = (char *)dVar5.units;
    if (dVar5.codepoint != *pcVar1 || pcVar2 == (char *)0x0) {
      return false;
    }
    pcVar4 = pcVar4 + (long)pcVar2;
    this = this + -(long)pcVar2;
    pcVar1 = pcVar1 + 1;
  }
  return this == (jessilib *)0x0 && pcVar3 == (char *)0x0;
}

Assistant:

bool equals(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		return lhs == rhs;
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (lhs_front.codepoint != rhs_front.codepoint) {
			// Codepoints aren't the same
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}